

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O2

void __thiscall Farm::editTruck(Farm *this)

{
  pointer pTVar1;
  bool bVar2;
  __type_conflict _Var3;
  ostream *poVar4;
  pointer this_00;
  double capacity;
  string plate;
  allocator local_99;
  string local_98;
  double local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"Enter truck\'s plate: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_70);
  std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
  bVar2 = searchTruckByPlate(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_98,"Enter truck\'s new capacity: ",&local_99);
    getDouble(&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    pTVar1 = (this->trucks).super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->trucks).super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
      Truck::getPlate_abi_cxx11_(&local_98,this_00);
      _Var3 = std::operator==(&local_98,&local_70);
      std::__cxx11::string::~string((string *)&local_98);
      if (_Var3) {
        Truck::setCapacity(this_00,local_78);
        break;
      }
    }
    this->farmFileChanged = true;
    poVar4 = std::operator<<((ostream *)&std::cout,"Truck successfully edited!");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_98,"ENTER to go back",&local_99);
    enterWait(&local_98);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_98,"ERROR: It doesn\'t exist a truck with the given plate!",
               &local_99);
    cinERR(&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"ENTER to go back",&local_99);
    enterWait(&local_98);
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void Farm::editTruck() {
    string plate;
    double capacity;

    cout << "Enter truck's plate: ";
    getline(cin, plate);
    if(!searchTruckByPlate(plate)){
        cinERR("ERROR: It doesn't exist a truck with the given plate!");
        enterWait();
        return;
    }

    getDouble(capacity, "Enter truck's new capacity: ");

    for(auto &truck : trucks){
        if(truck.getPlate() == plate){
            truck.setCapacity(capacity);
            break;
        }
    }

    farmFileChanged = true;
    cout << "Truck successfully edited!" << endl;
    enterWait();
}